

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_algor.cc
# Opt level: O0

void X509_ALGOR_get0(ASN1_OBJECT **paobj,int *pptype,void **ppval,X509_ALGOR *algor)

{
  void *local_38;
  void *value;
  int type;
  X509_ALGOR *alg_local;
  void **out_param_value_local;
  int *out_param_type_local;
  ASN1_OBJECT **out_obj_local;
  
  if (paobj != (ASN1_OBJECT **)0x0) {
    *paobj = algor->algorithm;
  }
  if (pptype != (int *)0x0) {
    value._4_4_ = -1;
    local_38 = (void *)0x0;
    if (algor->parameter != (ASN1_TYPE *)0x0) {
      value._4_4_ = algor->parameter->type;
      local_38 = asn1_type_value_as_pointer((ASN1_TYPE *)algor->parameter);
    }
    *pptype = value._4_4_;
    if (ppval != (void **)0x0) {
      *ppval = local_38;
    }
  }
  return;
}

Assistant:

void X509_ALGOR_get0(const ASN1_OBJECT **out_obj, int *out_param_type,
                     const void **out_param_value, const X509_ALGOR *alg) {
  if (out_obj != NULL) {
    *out_obj = alg->algorithm;
  }
  if (out_param_type != NULL) {
    int type = V_ASN1_UNDEF;
    const void *value = NULL;
    if (alg->parameter != NULL) {
      type = alg->parameter->type;
      value = asn1_type_value_as_pointer(alg->parameter);
    }
    *out_param_type = type;
    if (out_param_value != NULL) {
      *out_param_value = value;
    }
  }
}